

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readComment(OurReader *this)

{
  char cVar1;
  char *pcVar2;
  CommentPlacement placement;
  Location begin;
  Location pCVar3;
  bool bVar4;
  
  pcVar2 = this->current_;
  if (pcVar2 == this->end_) {
    return false;
  }
  this->current_ = pcVar2 + 1;
  cVar1 = *pcVar2;
  if (cVar1 == '*') {
    bVar4 = readCStyleComment(this);
    if (!bVar4) {
      return false;
    }
  }
  else {
    if (cVar1 != '/') {
      return false;
    }
    readCppStyleComment(this);
  }
  if (this->collectComments_ != true) {
    return true;
  }
  begin = pcVar2 + -1;
  pcVar2 = this->lastValueEnd_;
  placement = commentBefore;
  if (pcVar2 != (char *)0x0) {
    if (pcVar2 < begin) {
      bVar4 = true;
      do {
        if ((*pcVar2 == '\n') || (*pcVar2 == '\r')) break;
        pcVar2 = pcVar2 + 1;
        bVar4 = pcVar2 < begin;
      } while (pcVar2 != begin);
      placement = commentBefore;
      if (bVar4) goto LAB_0011eeba;
    }
    if ((cVar1 == '*') && (pcVar2 = this->current_, begin < pcVar2)) {
      bVar4 = true;
      pCVar3 = begin;
      do {
        if ((*pCVar3 == '\n') || (*pCVar3 == '\r')) break;
        pCVar3 = pCVar3 + 1;
        bVar4 = pCVar3 < pcVar2;
      } while (pCVar3 != pcVar2);
      placement = commentBefore;
      if (bVar4) goto LAB_0011eeba;
    }
    placement = commentAfterOnSameLine;
  }
LAB_0011eeba:
  addComment(this,begin,this->current_,placement);
  return true;
}

Assistant:

bool OurReader::readComment() {
  Location commentBegin = current_ - 1;
  Char c = getNextChar();
  bool successful = false;
  if (c == '*')
    successful = readCStyleComment();
  else if (c == '/')
    successful = readCppStyleComment();
  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;
    if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
      if (c != '*' || !containsNewLine(commentBegin, current_))
        placement = commentAfterOnSameLine;
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}